

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O0

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  bool bVar1;
  string *psVar2;
  undefined7 extraout_var;
  IRBuilder *this_00;
  IRHandler *pIVar3;
  BasicBlock *bb;
  ConstantInt *result;
  undefined7 extraout_var_00;
  uchar *sig;
  undefined4 in_register_00000034;
  uchar *in_R8;
  size_t in_R9;
  allocator<char> local_59;
  string local_58;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  i;
  HandlerSym *handlerSym_local;
  IRGenerator *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_register_00000034,__fd);
  bVar1 = std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::empty
                    (&this->handlerStack_);
  if (!bVar1) {
    __assert_fail("handlerStack_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/lang/IRGenerator.cc"
                  ,0x7e,"virtual void flow::lang::IRGenerator::accept(HandlerSym &)");
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&this->exports_);
  if (!bVar1) {
    local_28._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->exports_);
    local_30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->exports_);
    psVar2 = Symbol::name_abi_cxx11_((Symbol *)i._M_current);
    local_20 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_28,local_30,psVar2);
    local_38._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->exports_);
    bVar1 = __gnu_cxx::operator==(&local_20,&local_38);
    if (bVar1) {
      return (int)CONCAT71(extraout_var,bVar1);
    }
  }
  this_00 = &this->super_IRBuilder;
  psVar2 = Symbol::name_abi_cxx11_((Symbol *)i._M_current);
  pIVar3 = IRBuilder::getHandler(this_00,psVar2);
  IRBuilder::setHandler(this_00,pIVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"EntryPoint",&local_59);
  bb = IRBuilder::createBlock(this_00,&local_58);
  IRBuilder::setInsertPoint(this_00,bb);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  codegenInline(this,(HandlerSym *)i._M_current);
  result = IRBuilder::get(&this->super_IRBuilder,0);
  IRBuilder::createRet(&this->super_IRBuilder,(Value *)result);
  pIVar3 = IRBuilder::handler(&this->super_IRBuilder);
  IRHandler::verify(pIVar3,(EVP_PKEY_CTX *)result,sig,(size_t)__addr_len,in_R8,in_R9);
  bVar1 = std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::empty
                    (&this->handlerStack_);
  if (bVar1) {
    return (int)CONCAT71(extraout_var_00,bVar1);
  }
  __assert_fail("handlerStack_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/lang/IRGenerator.cc"
                ,0x90,"virtual void flow::lang::IRGenerator::accept(HandlerSym &)");
}

Assistant:

void IRGenerator::accept(HandlerSym& handlerSym) {
  assert(handlerStack_.empty());

  if (!exports_.empty()) {
    auto i = std::find(exports_.begin(), exports_.end(), handlerSym.name());
    if (i == exports_.end()) {
      return;
    }
  }

  setHandler(getHandler(handlerSym.name()));
  setInsertPoint(createBlock("EntryPoint"));

  codegenInline(handlerSym);

  createRet(get(false));

  handler()->verify();

  assert(handlerStack_.empty());
}